

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

int32_t sym_GetValue(Symbol *sym)

{
  int iVar1;
  int32_t iVar2;
  Section *pSVar3;
  
  if (sym->type < SYM_MACRO) {
    if (sym->hasCallback == true) {
      iVar2 = (*(sym->field_8).numCallback)();
      return iVar2;
    }
    if (sym->type == SYM_LABEL) {
      iVar1 = (sym->field_8).value;
      if (PCSymbol == sym) {
        pSVar3 = sect_GetSymbolSection();
      }
      else {
        pSVar3 = sym->section;
      }
      return iVar1 + pSVar3->org;
    }
  }
  return (sym->field_8).value;
}

Assistant:

int32_t sym_GetValue(struct Symbol const *sym)
{
	if (sym_IsNumeric(sym) && sym->hasCallback)
		return sym->numCallback();

	if (sym->type == SYM_LABEL)
		// TODO: do not use section's org directly
		return sym->value + sym_GetSection(sym)->org;

	return sym->value;
}